

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2ImplicitConversions(void)

{
  bool bVar1;
  StringPiece local_1d8;
  StringPiece re_stringpiece;
  string re_string;
  LogMessageFatal local_198;
  
  std::__cxx11::string::string((string *)&re_string,".",(allocator *)&local_198);
  re_stringpiece.ptr_ = ".";
  local_1d8.length_ = 1;
  local_1d8.ptr_ = "e";
  re_stringpiece.length_ = local_1d8.length_;
  RE2::RE2((RE2 *)&local_198,&re_string);
  bVar1 = RE2::PartialMatch<>(&local_1d8,(RE2 *)&local_198);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4d8);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"e\", re_string)");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  local_1d8.ptr_ = "e";
  local_1d8.length_ = 1;
  RE2::RE2((RE2 *)&local_198,&re_stringpiece);
  bVar1 = RE2::PartialMatch<>(&local_1d8,(RE2 *)&local_198);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4d9);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"e\", re_stringpiece)");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  local_1d8.ptr_ = "e";
  local_1d8.length_ = 1;
  RE2::RE2((RE2 *)&local_198,".");
  bVar1 = RE2::PartialMatch<>(&local_1d8,(RE2 *)&local_198);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4da);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"e\", re_cstring)");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  local_1d8.ptr_ = "e";
  local_1d8.length_ = 1;
  RE2::RE2((RE2 *)&local_198,".");
  bVar1 = RE2::PartialMatch<>(&local_1d8,(RE2 *)&local_198);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4db);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"e\", \".\")");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  std::__cxx11::string::~string((string *)&re_string);
  return;
}

Assistant:

TEST(RE2, ImplicitConversions) {
  string re_string(".");
  StringPiece re_stringpiece(".");
  const char* re_cstring = ".";
  EXPECT_TRUE(RE2::PartialMatch("e", re_string));
  EXPECT_TRUE(RE2::PartialMatch("e", re_stringpiece));
  EXPECT_TRUE(RE2::PartialMatch("e", re_cstring));
  EXPECT_TRUE(RE2::PartialMatch("e", "."));
}